

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O3

void GradientUnfilter_SSE2(uint8_t *prev,uint8_t *in,uint8_t *out,int width)

{
  ulong uVar1;
  undefined8 uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  unkuint9 Var26;
  undefined1 auVar27 [11];
  undefined1 auVar28 [15];
  unkuint9 Var29;
  undefined1 auVar30 [11];
  undefined1 auVar31 [15];
  undefined1 auVar32 [11];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [13];
  ulong uVar40;
  uint uVar41;
  byte bVar42;
  int iVar43;
  short sVar44;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  undefined1 auVar45 [16];
  short sVar53;
  undefined1 auVar46 [16];
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  char cVar62;
  char cVar63;
  char cVar64;
  char cVar65;
  char cVar66;
  char cVar67;
  char cVar68;
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  ulong uVar70;
  long lVar72;
  
  if (prev != (uint8_t *)0x0) {
    uVar3 = *prev;
    uVar4 = *in;
    *out = uVar3 + uVar4;
    if (1 < width) {
      uVar41 = width - 1;
      if ((uVar41 & 0x7ffffff8) == 0) {
        uVar40 = 0;
      }
      else {
        auVar45 = ZEXT116((byte)(uVar3 + uVar4));
        uVar40 = 0;
        do {
          uVar70 = *(ulong *)(prev + uVar40 + 1);
          uVar1 = *(ulong *)(prev + uVar40);
          auVar5._8_6_ = 0;
          auVar5._0_8_ = uVar70;
          auVar5[0xe] = (char)(uVar70 >> 0x38);
          auVar8._8_4_ = 0;
          auVar8._0_8_ = uVar70;
          auVar8[0xc] = (char)(uVar70 >> 0x30);
          auVar8._13_2_ = auVar5._13_2_;
          auVar11._8_4_ = 0;
          auVar11._0_8_ = uVar70;
          auVar11._12_3_ = auVar8._12_3_;
          auVar14._8_2_ = 0;
          auVar14._0_8_ = uVar70;
          auVar14[10] = (char)(uVar70 >> 0x28);
          auVar14._11_4_ = auVar11._11_4_;
          auVar17._8_2_ = 0;
          auVar17._0_8_ = uVar70;
          auVar17._10_5_ = auVar14._10_5_;
          auVar20[8] = (char)(uVar70 >> 0x20);
          auVar20._0_8_ = uVar70;
          auVar20._9_6_ = auVar17._9_6_;
          auVar25._7_8_ = 0;
          auVar25._0_7_ = auVar20._8_7_;
          Var26 = CONCAT81(SUB158(auVar25 << 0x40,7),(char)(uVar70 >> 0x18));
          auVar33._9_6_ = 0;
          auVar33._0_9_ = Var26;
          auVar27._1_10_ = SUB1510(auVar33 << 0x30,5);
          auVar27[0] = (char)(uVar70 >> 0x10);
          auVar34._11_4_ = 0;
          auVar34._0_11_ = auVar27;
          auVar23[2] = (char)(uVar70 >> 8);
          auVar23._0_2_ = (ushort)uVar70;
          auVar23._3_12_ = SUB1512(auVar34 << 0x20,3);
          auVar6._8_6_ = 0;
          auVar6._0_8_ = uVar1;
          auVar6[0xe] = (char)(uVar1 >> 0x38);
          auVar9._8_4_ = 0;
          auVar9._0_8_ = uVar1;
          auVar9[0xc] = (char)(uVar1 >> 0x30);
          auVar9._13_2_ = auVar6._13_2_;
          auVar12._8_4_ = 0;
          auVar12._0_8_ = uVar1;
          auVar12._12_3_ = auVar9._12_3_;
          auVar15._8_2_ = 0;
          auVar15._0_8_ = uVar1;
          auVar15[10] = (char)(uVar1 >> 0x28);
          auVar15._11_4_ = auVar12._11_4_;
          auVar18._8_2_ = 0;
          auVar18._0_8_ = uVar1;
          auVar18._10_5_ = auVar15._10_5_;
          auVar21[8] = (char)(uVar1 >> 0x20);
          auVar21._0_8_ = uVar1;
          auVar21._9_6_ = auVar18._9_6_;
          auVar28._7_8_ = 0;
          auVar28._0_7_ = auVar21._8_7_;
          Var29 = CONCAT81(SUB158(auVar28 << 0x40,7),(char)(uVar1 >> 0x18));
          auVar35._9_6_ = 0;
          auVar35._0_9_ = Var29;
          auVar30._1_10_ = SUB1510(auVar35 << 0x30,5);
          auVar30[0] = (char)(uVar1 >> 0x10);
          auVar36._11_4_ = 0;
          auVar36._0_11_ = auVar30;
          auVar24[2] = (char)(uVar1 >> 8);
          auVar24._0_2_ = (ushort)uVar1;
          auVar24._3_12_ = SUB1512(auVar36 << 0x20,3);
          sVar54 = ((ushort)uVar70 & 0xff) - ((ushort)uVar1 & 0xff);
          sVar55 = auVar23._2_2_ - auVar24._2_2_;
          sVar56 = auVar27._0_2_ - auVar30._0_2_;
          sVar57 = (short)Var26 - (short)Var29;
          sVar58 = auVar20._8_2_ - auVar21._8_2_;
          sVar59 = auVar14._10_2_ - auVar15._10_2_;
          sVar60 = auVar8._12_2_ - auVar9._12_2_;
          sVar61 = (auVar5._13_2_ >> 8) - (auVar6._13_2_ >> 8);
          uVar2 = *(undefined8 *)(in + uVar40 + 1);
          sVar44 = auVar45._0_2_ + sVar54;
          sVar47 = auVar45._2_2_ + sVar55;
          sVar48 = auVar45._4_2_ + sVar56;
          sVar49 = auVar45._6_2_ + sVar57;
          sVar50 = auVar45._8_2_ + sVar58;
          sVar51 = auVar45._10_2_ + sVar59;
          sVar52 = auVar45._12_2_ + sVar60;
          sVar53 = auVar45._14_2_ + sVar61;
          cVar62 = (char)((ulong)uVar2 >> 8);
          auVar46[1] = ((0 < sVar47) * (sVar47 < 0x100) * (char)sVar47 - (0xff < sVar47)) + cVar62;
          auVar46[0] = ((0 < sVar44) * (sVar44 < 0x100) * (char)sVar44 - (0xff < sVar44)) +
                       (char)uVar2;
          cVar63 = (char)((ulong)uVar2 >> 0x10);
          auVar46[2] = ((0 < sVar48) * (sVar48 < 0x100) * (char)sVar48 - (0xff < sVar48)) + cVar63;
          cVar64 = (char)((ulong)uVar2 >> 0x18);
          auVar46[3] = ((0 < sVar49) * (sVar49 < 0x100) * (char)sVar49 - (0xff < sVar49)) + cVar64;
          cVar65 = (char)((ulong)uVar2 >> 0x20);
          auVar46[4] = ((0 < sVar50) * (sVar50 < 0x100) * (char)sVar50 - (0xff < sVar50)) + cVar65;
          cVar66 = (char)((ulong)uVar2 >> 0x28);
          auVar46[5] = ((0 < sVar51) * (sVar51 < 0x100) * (char)sVar51 - (0xff < sVar51)) + cVar66;
          cVar67 = (char)((ulong)uVar2 >> 0x30);
          auVar46[6] = ((0 < sVar52) * (sVar52 < 0x100) * (char)sVar52 - (0xff < sVar52)) + cVar67;
          cVar68 = (char)((ulong)uVar2 >> 0x38);
          auVar46[7] = ((0 < sVar53) * (sVar53 < 0x100) * (char)sVar53 - (0xff < sVar53)) + cVar68;
          auVar46[8] = (0 < sVar44) * (sVar44 < 0x100) * (char)sVar44 - (0xff < sVar44);
          auVar46[9] = (0 < sVar47) * (sVar47 < 0x100) * (char)sVar47 - (0xff < sVar47);
          auVar46[10] = (0 < sVar48) * (sVar48 < 0x100) * (char)sVar48 - (0xff < sVar48);
          auVar46[0xb] = (0 < sVar49) * (sVar49 < 0x100) * (char)sVar49 - (0xff < sVar49);
          auVar46[0xc] = (0 < sVar50) * (sVar50 < 0x100) * (char)sVar50 - (0xff < sVar50);
          auVar46[0xd] = (0 < sVar51) * (sVar51 < 0x100) * (char)sVar51 - (0xff < sVar51);
          auVar46[0xe] = (0 < sVar52) * (sVar52 < 0x100) * (char)sVar52 - (0xff < sVar52);
          auVar46[0xf] = 0;
          auVar46 = auVar46 & ZEXT416(0xff);
          iVar43 = -7;
          auVar45 = auVar46;
          auVar71 = ZEXT416(0xff);
          do {
            auVar69._0_8_ = auVar45._0_8_ << 8;
            auVar69._8_8_ = auVar45._8_8_ << 8;
            lVar72 = auVar71._8_8_;
            uVar70 = auVar71._0_8_;
            auVar71._0_8_ = uVar70 << 8;
            auVar71._8_8_ = lVar72 << 8 | uVar70 >> 0x38;
            auVar7[0xd] = 0;
            auVar7._0_13_ = auVar69._0_13_;
            auVar7[0xe] = auVar45[6];
            auVar10[0xc] = auVar45[5];
            auVar10._0_12_ = auVar69._0_12_;
            auVar10._13_2_ = auVar7._13_2_;
            auVar13[0xb] = 0;
            auVar13._0_11_ = auVar69._0_11_;
            auVar13._12_3_ = auVar10._12_3_;
            auVar16[10] = auVar45[4];
            auVar16._0_10_ = auVar69._0_10_;
            auVar16._11_4_ = auVar13._11_4_;
            auVar19[9] = 0;
            auVar19._0_9_ = auVar69._0_9_;
            auVar19._10_5_ = auVar16._10_5_;
            auVar22[8] = auVar45[3];
            auVar22._0_8_ = auVar69._0_8_;
            auVar22._9_6_ = auVar19._9_6_;
            auVar31._7_8_ = 0;
            auVar31._0_7_ = auVar22._8_7_;
            Var26 = CONCAT81(SUB158(auVar31 << 0x40,7),auVar45[2]);
            auVar37._9_6_ = 0;
            auVar37._0_9_ = Var26;
            auVar32._1_10_ = SUB1510(auVar37 << 0x30,5);
            auVar32[0] = auVar45[1];
            auVar38._11_4_ = 0;
            auVar38._0_11_ = auVar32;
            auVar39._1_12_ = SUB1512(auVar38 << 0x20,3);
            auVar39[0] = auVar45[0];
            sVar44 = auVar39._0_2_ + sVar55;
            sVar47 = auVar32._0_2_ + sVar56;
            sVar48 = (short)Var26 + sVar57;
            sVar49 = auVar22._8_2_ + sVar58;
            sVar50 = auVar16._10_2_ + sVar59;
            sVar51 = auVar10._12_2_ + sVar60;
            sVar52 = (auVar7._13_2_ >> 8) + sVar61;
            auVar45[0] = ((0 < sVar54) * (sVar54 < 0x100) * (char)sVar54 - (0xff < sVar54)) +
                         (char)uVar2;
            auVar45[1] = ((0 < sVar44) * (sVar44 < 0x100) * (char)sVar44 - (0xff < sVar44)) + cVar62
            ;
            auVar45[2] = ((0 < sVar47) * (sVar47 < 0x100) * (char)sVar47 - (0xff < sVar47)) + cVar63
            ;
            auVar45[3] = ((0 < sVar48) * (sVar48 < 0x100) * (char)sVar48 - (0xff < sVar48)) + cVar64
            ;
            auVar45[4] = ((0 < sVar49) * (sVar49 < 0x100) * (char)sVar49 - (0xff < sVar49)) + cVar65
            ;
            auVar45[5] = ((0 < sVar50) * (sVar50 < 0x100) * (char)sVar50 - (0xff < sVar50)) + cVar66
            ;
            auVar45[6] = ((0 < sVar51) * (sVar51 < 0x100) * (char)sVar51 - (0xff < sVar51)) + cVar67
            ;
            auVar45[7] = ((0 < sVar52) * (sVar52 < 0x100) * (char)sVar52 - (0xff < sVar52)) + cVar68
            ;
            auVar45._8_8_ = 0;
            auVar45 = auVar45 & auVar71;
            auVar46 = auVar46 | auVar45;
            iVar43 = iVar43 + 1;
          } while (iVar43 != 0);
          auVar45 = auVar45 >> 0x38;
          *(long *)(out + uVar40 + 1) = auVar46._0_8_;
          uVar40 = uVar40 + 8;
        } while (uVar40 < (uVar41 & 0x7ffffff8));
      }
      if ((int)uVar40 < (int)uVar41) {
        uVar40 = uVar40 & 0xffffffff;
        bVar42 = out[uVar40];
        do {
          iVar43 = ((uint)bVar42 + (uint)prev[uVar40 + 1]) - (uint)prev[uVar40];
          if (iVar43 < 1) {
            iVar43 = 0;
          }
          if (0xfe < iVar43) {
            iVar43 = 0xff;
          }
          bVar42 = (char)iVar43 + in[uVar40 + 1];
          out[uVar40 + 1] = bVar42;
          uVar40 = uVar40 + 1;
        } while (uVar41 != uVar40);
      }
    }
    return;
  }
  HorizontalUnfilter_SSE2((uint8_t *)0x0,in,out,width);
  return;
}

Assistant:

static void GradientUnfilter_SSE2(const uint8_t* prev, const uint8_t* in,
                                  uint8_t* out, int width) {
  if (prev == NULL) {
    HorizontalUnfilter_SSE2(NULL, in, out, width);
  } else {
    out[0] = (uint8_t)(in[0] + prev[0]);  // predict from above
    GradientPredictInverse_SSE2(in + 1, prev + 1, out + 1, width - 1);
  }
}